

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

int QInputDialog::getInt
              (QWidget *parent,QString *title,QString *label,int value,int min,int max,int step,
              bool *ok,WindowFlags flags)

{
  bool bVar1;
  int iVar2;
  QInputDialog *this;
  long in_FS_OFFSET;
  QAutoPointer<QInputDialog> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.o.wp.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.o.wp.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this = (QInputDialog *)operator_new(0x28);
  QInputDialog(this,parent,flags);
  QPointer<QInputDialog>::QPointer<void>(&local_48.o,this);
  QWidget::setWindowTitle((QWidget *)local_48.o.wp.value,title);
  setLabelText((QInputDialog *)local_48.o.wp.value,label);
  setIntRange((QInputDialog *)local_48.o.wp.value,min,max);
  setIntValue((QInputDialog *)local_48.o.wp.value,value);
  setIntStep((QInputDialog *)local_48.o.wp.value,step);
  iVar2 = (**(code **)(*(long *)local_48.o.wp.value + 0x1a8))();
  if (ok != (bool *)0x0) {
    *ok = iVar2 != 0;
  }
  bVar1 = QAutoPointer::operator_cast_to_bool((QAutoPointer *)&local_48);
  if (iVar2 != 0 && bVar1) {
    value = intValue((QInputDialog *)local_48.o.wp.value);
  }
  QAutoPointer<QInputDialog>::~QAutoPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return value;
  }
  __stack_chk_fail();
}

Assistant:

int QInputDialog::getInt(QWidget *parent, const QString &title, const QString &label, int value,
                         int min, int max, int step, bool *ok, Qt::WindowFlags flags)
{
    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setIntRange(min, max);
    dialog->setIntValue(value);
    dialog->setIntStep(step);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->intValue();
    } else {
        return value;
    }
}